

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O2

ostream * pfd::operator<<(ostream *s,
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *v)

{
  pointer pbVar1;
  char *pcVar2;
  ostream *poVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  pointer pbVar5;
  bool bVar6;
  
  pbVar1 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (pbVar5 = (v->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    bVar6 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    pcVar2 = ", ";
    if (bVar6) {
      pcVar2 = "\a";
    }
    poVar3 = std::operator<<(s,pcVar2 + 1);
    std::operator<<(poVar3,(string *)pbVar5);
  }
  return s;
}

Assistant:

inline std::ostream& operator <<(std::ostream &s, std::vector<std::string> const &v)
{
    int not_first = 0;
    for (auto &e : v)
        s << (not_first++ ? " " : "") << e;
    return s;
}